

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

void __thiscall LiteScript::Class::Inherit(Class *this,Variable *v)

{
  undefined8 *puVar1;
  Class *pCVar2;
  bool bVar3;
  Object *pOVar4;
  Type *this_00;
  ulong uVar5;
  long lVar6;
  Variable VStack_38;
  
  pOVar4 = Variable::operator->(v);
  this_00 = Object::GetType(pOVar4);
  bVar3 = Type::operator!=(this_00,(Type *)_type_class);
  if (!bVar3) {
    pOVar4 = Variable::operator->(v);
    pCVar2 = (Class *)pOVar4->data;
    if (pCVar2 != this) {
      Variable::Variable(&VStack_38,v);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
      emplace_back<LiteScript::Variable>(&this->inherit,&VStack_38);
      Variable::~Variable(&VStack_38);
      uVar5 = ((long)(pCVar2->s_members).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pCVar2->s_members).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      if ((int)uVar5 != 0) {
        lVar6 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)&(((pCVar2->s_members).
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                   lVar6);
          AddStatic(this,(char *)*puVar1,(Variable *)(puVar1 + 4));
          lVar6 = lVar6 + 0x30;
        } while ((uVar5 & 0xffffffff) * 0x30 != lVar6);
      }
      uVar5 = ((long)(pCVar2->us_members).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pCVar2->us_members).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      if ((int)uVar5 != 0) {
        lVar6 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)&(((pCVar2->us_members).
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                   lVar6);
          AddUnstatic(this,(char *)*puVar1,(Variable *)(puVar1 + 4));
          lVar6 = lVar6 + 0x30;
        } while ((uVar5 & 0xffffffff) * 0x30 != lVar6);
      }
    }
  }
  return;
}

Assistant:

void LiteScript::Class::Inherit(const Variable &v) {
    if (v->GetType() != Type::CLASS)
        return;
    const Class& C = v->GetData<Class>();
    if (this == &C)
        return;
    this->inherit.push_back(Variable(v));
    for (unsigned int i = 0, sz = C.s_members.size(); i < sz; i++)
        this->AddStatic(C.s_members[i].first.c_str(), C.s_members[i].second);
    for (unsigned int i = 0, sz = C.us_members.size(); i < sz; i++)
        this->AddUnstatic(C.us_members[i].first.c_str(), C.us_members[i].second);
}